

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

void compute_deriv(qnode_ptr_t c,qnode_ptr_t f,int horn)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  param512_t *papVar4;
  long lVar5;
  int iVar6;
  int *piVar7;
  qnode_ptr_t q;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  int local_5c;
  
  q = (qnode_ptr_t)(ulong)(uint)f->sizy;
  iVar14 = f->ofst;
  iVar8 = f->sizy - iVar14;
  if (iVar14 < iVar8) {
    iVar9 = f->sizx;
    iVar6 = iVar14;
    do {
      if (iVar14 < iVar9 - iVar14) {
        uVar3 = (ulong)(uint)f->sizz;
        iVar8 = iVar14;
        do {
          if (0 < (int)uVar3) {
            lVar12 = 0;
            do {
              fVar15 = dx(c,f,iVar6,iVar8,(int)lVar12);
              (*f->param_ptr[lVar12])[f->res * iVar6 + iVar8].fx = fVar15;
              fVar15 = dy(c,f,iVar6,iVar8,(int)lVar12);
              (*f->param_ptr[lVar12])[f->res * iVar6 + iVar8].fy = fVar15;
              lVar12 = lVar12 + 1;
              uVar3 = (ulong)f->sizz;
            } while (lVar12 < (long)uVar3);
            iVar9 = f->sizx;
            iVar14 = f->ofst;
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < iVar9 - iVar14);
        q = (qnode_ptr_t)(ulong)(uint)f->sizy;
      }
      iVar6 = iVar6 + 1;
      iVar8 = (int)q - iVar14;
    } while (iVar6 < iVar8);
  }
  iVar9 = (int)q;
  iVar6 = c->sizz / 2;
  if (iVar14 < iVar8) {
    iVar2 = f->sizx;
    local_5c = iVar14;
    do {
      if (iVar14 < iVar2 - iVar14) {
        piVar7 = &(*f->param_ptr[iVar6])[(long)local_5c * (long)f->res + (long)iVar14].err;
        iVar13 = iVar2 + iVar14 * -2;
        iVar11 = iVar14;
        do {
          if (*piVar7 == 0) {
            fVar15 = dt(c,q,local_5c,iVar11);
            piVar7[-4] = (int)fVar15;
          }
          iVar11 = iVar11 + 1;
          piVar7 = piVar7 + 8;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      local_5c = local_5c + 1;
    } while (local_5c != iVar8);
  }
  iVar8 = iVar9 - iVar14;
  if ((horn == 0) && (iVar14 < iVar8)) {
    iVar2 = f->sizx;
    iVar11 = iVar14;
    do {
      if (iVar14 < iVar2 - iVar14) {
        papVar4 = f->param_ptr[iVar6];
        iVar8 = f->res;
        lVar12 = (long)iVar14;
        do {
          if ((*papVar4)[iVar11 * iVar8 + lVar12].err == 0) {
            iVar14 = (int)lVar12;
            fVar15 = dxx(f,iVar11,iVar14,iVar6);
            (*f->param_ptr[iVar6])[(long)f->res * (long)iVar11 + lVar12].fxx = fVar15;
            fVar15 = dyy(f,iVar11,iVar14,iVar6);
            (*f->param_ptr[iVar6])[(long)f->res * (long)iVar11 + lVar12].fyy = fVar15;
            fVar15 = dxy(f,iVar11,iVar14,iVar6);
            papVar4 = f->param_ptr[iVar6];
            iVar8 = f->res;
            (*papVar4)[iVar11 * iVar8 + lVar12].fxy = fVar15;
            iVar2 = f->sizx;
            iVar14 = f->ofst;
          }
          lVar12 = lVar12 + 1;
        } while ((int)lVar12 < iVar2 - iVar14);
        iVar9 = f->sizy;
      }
      iVar11 = iVar11 + 1;
      iVar8 = iVar9 - iVar14;
    } while (iVar11 < iVar8);
  }
  if (iVar14 < iVar8) {
    lVar5 = (long)iVar14;
    lVar12 = f->sizx - lVar5;
    iVar9 = iVar14;
    do {
      if (iVar14 < (int)lVar12) {
        piVar7 = &(*f->param_ptr[iVar6])[(long)iVar9 * (long)f->res + lVar5].err;
        lVar10 = lVar5;
        do {
          if (*piVar7 == 0) {
            fVar15 = (float)*(undefined8 *)(piVar7 + -3);
            fVar1 = (float)((ulong)*(undefined8 *)(piVar7 + -3) >> 0x20);
            piVar7[-1] = (int)SQRT(fVar1 * fVar1 + fVar15 * fVar15);
          }
          lVar10 = lVar10 + 1;
          piVar7 = piVar7 + 8;
        } while (lVar10 < lVar12);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar8);
  }
  return;
}

Assistant:

void compute_deriv(qnode_ptr_t c, qnode_ptr_t f, int horn)
{ float dxx(), dyy(), dxy(), dx(), dy(), dt() ;
  param_t P ;
  int i, j, k ;

  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      for (k = 0 ; k < f->sizz ; k++) {
        (*f->param_ptr[k])[f->res*i + j].fx = dx(c,f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fy = dy(c,f,i,j,k) ;
      }
    }
  }
  k = c->sizz/2 ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].ft = dt(c,f,i,j) ;
      }
    }
  }
  if (!horn) {
    for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
      for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
        if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
          (*f->param_ptr[k])[f->res*i + j].fxx = dxx(f,i,j,k) ;
          (*f->param_ptr[k])[f->res*i + j].fyy = dyy(f,i,j,k) ;
          (*f->param_ptr[k])[f->res*i + j].fxy = dxy(f,i,j,k) ;
        }
      }
    }
  }
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        P = (*f->param_ptr[k])[f->res*i + j] ;
        (*f->param_ptr[k])[f->res*i + j].mag =
        sqrt(pow(P.fx,2.0) + pow(P.fy,2.0)) ;
      }
    }
  }
}